

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_combo(nk_context *ctx,char **items,int count,int selected,int item_height,nk_vec2 size)

{
  char *pcVar1;
  nk_vec2 nVar2;
  ulong uVar3;
  int iVar4;
  float fVar5;
  float local_58;
  float fStack_54;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x616d,
                  "int nk_combo(struct nk_context *, const char **, int, int, int, struct nk_vec2)")
    ;
  }
  if (items != (char **)0x0) {
    if (ctx->current != (nk_window *)0x0) {
      if (count != 0) {
        iVar4 = (int)(ctx->style).window.spacing.y;
        nVar2 = nk_panel_get_padding(&ctx->style,ctx->current->layout->type);
        fStack_54 = size.y;
        fVar5 = (float)((item_height + iVar4) * count + ((int)nVar2.y + iVar4) * 2);
        if (fVar5 <= fStack_54) {
          fStack_54 = fVar5;
        }
        pcVar1 = items[selected];
        iVar4 = nk_strlen(pcVar1);
        local_58 = size.x;
        nVar2.y = fStack_54;
        nVar2.x = local_58;
        iVar4 = nk_combo_begin_text(ctx,pcVar1,iVar4,nVar2);
        if (iVar4 != 0) {
          nk_row_layout(ctx,NK_DYNAMIC,(float)item_height,1,0);
          if (0 < count) {
            uVar3 = 0;
            do {
              pcVar1 = items[uVar3];
              iVar4 = nk_strlen(pcVar1);
              iVar4 = nk_contextual_item_text(ctx,pcVar1,iVar4,0x11);
              if (iVar4 != 0) {
                selected = (int)uVar3;
              }
              uVar3 = uVar3 + 1;
            } while ((uint)count != uVar3);
          }
          nk_contextual_end(ctx);
        }
      }
      return selected;
    }
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x616f,
                  "int nk_combo(struct nk_context *, const char **, int, int, int, struct nk_vec2)")
    ;
  }
  __assert_fail("items",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x616e,
                "int nk_combo(struct nk_context *, const char **, int, int, int, struct nk_vec2)");
}

Assistant:

NK_API int
nk_combo(struct nk_context *ctx, const char **items, int count,
    int selected, int item_height, struct nk_vec2 size)
{
    int i = 0;
    int max_height;
    struct nk_vec2 item_spacing;
    struct nk_vec2 window_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(items);
    NK_ASSERT(ctx->current);
    if (!ctx || !items ||!count)
        return selected;

    item_spacing = ctx->style.window.spacing;
    window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
    max_height = count * item_height + count * (int)item_spacing.y;
    max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
    size.y = NK_MIN(size.y, (float)max_height);
    if (nk_combo_begin_label(ctx, items[selected], size)) {
        nk_layout_row_dynamic(ctx, (float)item_height, 1);
        for (i = 0; i < count; ++i) {
            if (nk_combo_item_label(ctx, items[i], NK_TEXT_LEFT))
                selected = i;
        }
        nk_combo_end(ctx);
    }
    return selected;
}